

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_GetGlyphBox(stbtt_fontinfo *info,int glyph_index,int *x0,int *y0,int *x1,int *y1)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = stbtt__GetGlyfOffset(info,glyph_index);
  if ((int)uVar1 < 0) {
    iVar2 = 0;
  }
  else {
    if (x0 != (int *)0x0) {
      *x0 = (int)(short)((ushort)info->data[(ulong)uVar1 + 2] << 8) |
            (uint)info->data[(ulong)uVar1 + 3];
    }
    if (y0 != (int *)0x0) {
      *y0 = (int)(short)((ushort)info->data[(ulong)uVar1 + 4] << 8) |
            (uint)info->data[(ulong)uVar1 + 5];
    }
    if (x1 != (int *)0x0) {
      *x1 = (int)(short)((ushort)info->data[(ulong)uVar1 + 6] << 8) |
            (uint)info->data[(ulong)uVar1 + 7];
    }
    iVar2 = 1;
    if (y1 != (int *)0x0) {
      *y1 = (int)(short)((ushort)info->data[(ulong)uVar1 + 8] << 8) |
            (uint)info->data[(ulong)uVar1 + 9];
    }
  }
  return iVar2;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphBox(const stbtt_fontinfo *info, int glyph_index, int *x0, int *y0, int *x1, int *y1)
{
   int g = stbtt__GetGlyfOffset(info, glyph_index);
   if (g < 0) return 0;

   if (x0) *x0 = ttSHORT(info->data + g + 2);
   if (y0) *y0 = ttSHORT(info->data + g + 4);
   if (x1) *x1 = ttSHORT(info->data + g + 6);
   if (y1) *y1 = ttSHORT(info->data + g + 8);
   return 1;
}